

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_header_gen.c
# Opt level: O2

RK_U32 h265e_data_to_sei(void *dst,RK_U8 *uuid,void *payload,RK_S32 size)

{
  RK_U8 *pRVar1;
  H265eNal sei_nal;
  H265eStream stream;
  
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","enter\n","h265e_data_to_sei");
  }
  h265e_stream_init(&stream);
  sei_nal.b_long_startcode = 0;
  sei_nal.i_first_mb = 0;
  sei_nal.i_last_mb = 0;
  sei_nal.i_payload = 0;
  sei_nal.i_padding = 0;
  sei_nal.sh_head_len = 0;
  sei_nal.temporal_id = 0;
  sei_nal._44_4_ = 0;
  sei_nal.i_ref_idc = 0;
  sei_nal.i_type = 0x27;
  pRVar1 = (RK_U8 *)((ulong)stream.enc_stream.byte_cnt + CONCAT44(stream.buf._4_4_,(int)stream.buf))
  ;
  sei_nal.p_payload = pRVar1;
  h265e_sei_write(&stream,uuid,(RK_U8 *)payload,size,5);
  sei_nal.i_payload = ((int)stream.buf + stream.enc_stream.byte_cnt) - (int)pRVar1;
  h265e_nal_encode((RK_U8 *)dst,&sei_nal);
  h265e_stream_deinit(&stream);
  if (((byte)h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_header_gen","leave\n","h265e_data_to_sei");
  }
  return sei_nal.i_payload;
}

Assistant:

RK_U32 h265e_data_to_sei(void *dst, RK_U8 uuid[16], const void *payload, RK_S32 size)
{
    H265eNal sei_nal;
    H265eStream stream;

    h265e_dbg_func("enter\n");

    h265e_stream_init(&stream);
    memset(&sei_nal, 0 , sizeof(H265eNal));

    sei_nal.i_type = NAL_SEI_PREFIX;
    sei_nal.p_payload = &stream.buf[stream.enc_stream.byte_cnt];

    h265e_sei_write(&stream, uuid, payload, size, H265_SEI_USER_DATA_UNREGISTERED);

    RK_U8 *end = &stream.buf[stream.enc_stream.byte_cnt];
    sei_nal.i_payload = (RK_S32)(end - sei_nal.p_payload);

    h265e_nal_encode(dst, &sei_nal);

    h265e_stream_deinit(&stream);

    h265e_dbg_func("leave\n");
    return sei_nal.i_payload;
}